

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

Dec_Graph_t *
Abc_ManResubQuit3(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,Abc_Obj_t *pObj2,
                 Abc_Obj_t *pObj3,int fOrGate)

{
  Dec_Node_t *pDVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t eEdge1;
  Dec_Graph_t *pGraph;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  Dec_Edge_t eEdge;
  uint local_48;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x306,
                  "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
                 );
  }
  if (pObj2 != pObj3) {
    pGraph = Dec_GraphCreate(4);
    pDVar1 = pGraph->pNodes;
    (pDVar1->field_2).pFunc = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
    pvVar3 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
    pDVar1[1].field_2.pFunc = pvVar3;
    pDVar1[2].field_2.pFunc = (void *)((ulong)pObj2 & 0xfffffffffffffffe);
    pvVar4 = (void *)((ulong)pObj3 & 0xfffffffffffffffe);
    pDVar1[3].field_2.pFunc = pvVar4;
    uVar5 = *(uint *)((long)((ulong)pObj0 & 0xfffffffffffffffe) + 0x14) >> 7;
    if (((ulong)pObj1 & 1) == 0 || ((ulong)pObj0 & 1) == 0) {
      DVar2 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uVar5 ^ (uint)pObj0) & 1),
                                  (Dec_Edge_t)
                                  (((uint)pObj1 ^ *(uint *)((long)pvVar3 + 0x14) >> 7) & 1 | 2));
    }
    else {
      DVar2 = Dec_GraphAddNodeOr(pGraph,(Dec_Edge_t)(uVar5 & 1),
                                 (Dec_Edge_t)(*(uint *)((long)pvVar3 + 0x14) >> 7 & 1 | 2));
    }
    uVar5 = *(uint *)((long)((ulong)pObj2 & 0xfffffffffffffffe) + 0x14) >> 7;
    if (((ulong)pObj3 & 1) == 0 || ((ulong)pObj2 & 1) == 0) {
      local_48 = (uint)pObj2;
      eEdge1 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uVar5 ^ local_48) & 1 | 4),
                                   (Dec_Edge_t)
                                   (((uint)pObj3 ^ *(uint *)((long)pvVar4 + 0x14) >> 7) & 1 | 6));
    }
    else {
      eEdge1 = Dec_GraphAddNodeOr(pGraph,(Dec_Edge_t)(uVar5 & 1 | 4),
                                  (Dec_Edge_t)(*(uint *)((long)pvVar4 + 0x14) >> 7 & 1 | 6));
    }
    if (fOrGate == 0) {
      DVar2 = Dec_GraphAddNodeAnd(pGraph,DVar2,eEdge1);
    }
    else {
      DVar2 = Dec_GraphAddNodeOr(pGraph,DVar2,eEdge1);
    }
    pGraph->eRoot = DVar2;
    if ((pRoot->field_0x14 & 0x80) != 0) {
      pGraph->eRoot = (Dec_Edge_t)((uint)DVar2 ^ 1);
    }
    return pGraph;
  }
  __assert_fail("pObj2 != pObj3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x307,
                "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
               );
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit3( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, Abc_Obj_t * pObj2, Abc_Obj_t * pObj3, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, ePrev0, ePrev1, eNode0, eNode1, eNode2, eNode3;
    assert( pObj0 != pObj1 );
    assert( pObj2 != pObj3 );
    pGraph = Dec_GraphCreate( 4 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    Dec_GraphNode( pGraph, 2 )->pFunc = Abc_ObjRegular(pObj2);
    Dec_GraphNode( pGraph, 3 )->pFunc = Abc_ObjRegular(pObj3);
    if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase );
        ePrev0 = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    else
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
        ePrev0 = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    if ( fOrGate ) 
        eRoot = Dec_GraphAddNodeOr( pGraph, ePrev0, ePrev1 );
    else
        eRoot = Dec_GraphAddNodeAnd( pGraph, ePrev0, ePrev1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}